

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O0

int mpt_message_buf2id(void *ptr,size_t len,uint64_t *iptr)

{
  ulong uStack_40;
  uint8_t val;
  size_t used;
  uint64_t id;
  uint8_t *buf;
  uint64_t *iptr_local;
  size_t len_local;
  void *ptr_local;
  
  if (len == 0) {
    if (iptr != (uint64_t *)0x0) {
      *iptr = 0;
    }
    ptr_local._4_4_ = 0;
  }
  else {
    uStack_40 = (ulong)(int)(uint)(*ptr != '\0');
    id = (long)ptr + 1;
    iptr_local = (uint64_t *)len;
    while (iptr_local == (uint64_t *)0x1) {
      if (((*(char *)id != '\0') || (uStack_40 != 0)) && (uStack_40 = uStack_40 + 1, 8 < uStack_40))
      {
        return -2;
      }
      id = id + 1;
      iptr_local = (uint64_t *)0x0;
    }
    ptr_local._4_4_ = (int)uStack_40;
  }
  return ptr_local._4_4_;
}

Assistant:

int mpt_message_buf2id(const void *ptr, size_t len, uint64_t *iptr)
{
	const uint8_t *buf = ptr;
	uint64_t id;
	size_t used;
	uint8_t val;
	
	if (!len) {
		if (iptr) *iptr = 0;
		return 0;
	}
	/* initial value setup */
	id = *buf++;
	used = id ? 1 : 0;
	
	/* add higher order ID parts */
	while (!--len) {
		val = *buf++;
		id *= 0x100;
		if ((val || used) && ++used > sizeof(id)) {
			return MPT_ERROR(BadValue);
		}
		id |= val;
	}
	return used;
}